

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# unit_definitions.hpp
# Opt level: O0

unit_data units::precise::custom::custom_count_unit(uint16_t customX)

{
  int iVar1;
  uint per_unit;
  uint iflag;
  uint eflag;
  unit_data local_14;
  uint16_t customX_local;
  
  iVar1 = bShift(customX,3);
  per_unit = bShiftu(customX,2);
  iflag = bShiftu(customX,1);
  eflag = bShiftu(customX,0);
  detail::unit_data::unit_data(&local_14,0,0,0,3,-3,0,-iVar1,0,0,0,per_unit,iflag,eflag,0);
  return local_14;
}

Assistant:

constexpr detail::unit_data custom_count_unit(std::uint16_t customX)
        {
            return {
                0,
                0,
                0,
                3,  // detection codes
                -3,  // detection codes
                0,
                -1 * bShift(customX, 3U),
                0,
                0,
                0,
                bShiftu(customX, 2U),
                bShiftu(customX, 1U),
                bShiftu(customX, 0U),
                0};
        }